

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O3

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar4;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar5;
  size_t sVar6;
  char *pcVar7;
  LIBSSH2_USERAUTH_KBDINT_RESPONSE *pLVar8;
  ulong uVar9;
  long lVar10;
  uchar *local_70;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_68;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_60;
  ulong local_58;
  char *local_50;
  size_t local_48;
  packet_requirev_state_t *local_40;
  time_t local_38;
  
  local_60 = response_callback;
  local_50 = user;
  local_38 = time((time_t *)0x0);
  local_68 = &session->userauth_kybd_prompts;
  local_48 = (size_t)(user_len + 0x37);
  local_40 = &session->userauth_kybd_packet_requirev_state;
  local_58 = (ulong)user_len;
LAB_0012be9a:
  switch(session->userauth_kybd_state) {
  case libssh2_NB_state_idle:
    session->userauth_kybd_auth_name = (uchar *)0x0;
    session->userauth_kybd_auth_instruction = (uchar *)0x0;
    session->userauth_kybd_num_prompts = 0;
    session->userauth_kybd_auth_failure = 1;
    ((packet_requirev_state_t *)(local_68 + 2))->start = 0;
    *local_68 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    local_68[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    session->userauth_kybd_packet_len = local_48;
    puVar3 = (uchar *)(*session->alloc)(local_48,&session->abstract);
    session->userauth_kybd_data = puVar3;
    if (puVar3 != (uchar *)0x0) {
      local_70 = puVar3 + 1;
      *puVar3 = '2';
      _libssh2_store_str(&local_70,local_50,local_58);
      _libssh2_store_str(&local_70,"ssh-connection",0xe);
      _libssh2_store_str(&local_70,"keyboard-interactive",0x14);
      _libssh2_store_u32(&local_70,0);
      _libssh2_store_u32(&local_70,0);
      session->userauth_kybd_state = libssh2_NB_state_created;
      goto switchD_0012beb8_caseD_2;
    }
    iVar2 = -6;
    pcVar7 = "Unable to allocate memory for keyboard-interactive authentication";
    break;
  default:
    goto switchD_0012beb8_caseD_1;
  case libssh2_NB_state_created:
switchD_0012beb8_caseD_2:
    iVar2 = _libssh2_transport_send
                      (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                       (uchar *)0x0,0);
    if (iVar2 == 0) {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
switchD_0012beb8_caseD_3:
        iVar2 = _libssh2_packet_requirev
                          (session,"43<",&session->userauth_kybd_data,
                           &session->userauth_kybd_data_len,0,(uchar *)0x0,0,local_40);
        if (iVar2 != 0) {
          if (iVar2 == -0x25) goto LAB_0012c2ea;
LAB_0012c2fb:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar2 = -0x12;
          pcVar7 = "Waiting for keyboard USERAUTH response";
          goto LAB_0012c314;
        }
        if (session->userauth_kybd_data_len == 0) goto LAB_0012c2fb;
        puVar3 = session->userauth_kybd_data;
        if (*puVar3 == '3') goto LAB_0012c36a;
        if (*puVar3 == '4') {
          (*session->free)(puVar3,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 8;
          iVar2 = 0;
          goto LAB_0012c3b6;
        }
        iVar2 = userauth_keyboard_interactive_decode_info_request(session);
        if (-1 < iVar2) {
          (*local_60)((char *)session->userauth_kybd_auth_name,
                      (int)session->userauth_kybd_auth_name_len,
                      (char *)session->userauth_kybd_auth_instruction,
                      (int)session->userauth_kybd_auth_instruction_len,
                      session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                      session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_packet_len = 5;
          if ((ulong)session->userauth_kybd_num_prompts != 0) {
            sVar6 = 5;
            lVar10 = 0;
            do {
              uVar1 = *(uint *)((long)&session->userauth_kybd_responses->length + lVar10);
              if (-sVar6 - 5 < (ulong)uVar1) goto LAB_0012c399;
              sVar6 = sVar6 + (uVar1 + 4);
              session->userauth_kybd_packet_len = sVar6;
              lVar10 = lVar10 + 0x10;
            } while ((ulong)session->userauth_kybd_num_prompts << 4 != lVar10);
          }
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          local_70 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,&session->abstract
                                               );
          session->userauth_kybd_data = local_70;
          if (local_70 == (uchar *)0x0) {
LAB_0012c399:
            iVar2 = -6;
            pcVar7 = "Unable to allocate memory for keyboard-interactive response packet";
          }
          else {
            *local_70 = '=';
            local_70 = local_70 + 1;
            _libssh2_store_u32(&local_70,session->userauth_kybd_num_prompts);
            if (session->userauth_kybd_num_prompts != 0) {
              lVar10 = 8;
              uVar9 = 0;
              do {
                _libssh2_store_str(&local_70,
                                   *(char **)((long)session->userauth_kybd_responses + lVar10 + -8),
                                   (ulong)*(uint *)((long)&session->userauth_kybd_responses->text +
                                                   lVar10));
                uVar9 = uVar9 + 1;
                lVar10 = lVar10 + 0x10;
              } while (uVar9 < session->userauth_kybd_num_prompts);
            }
            session->userauth_kybd_state = libssh2_NB_state_sent1;
switchD_0012beb8_caseD_4:
            iVar2 = _libssh2_transport_send
                              (session,session->userauth_kybd_data,session->userauth_kybd_packet_len
                               ,(uchar *)0x0,0);
            if (iVar2 == 0) {
              session->userauth_kybd_auth_failure = 0;
              goto switchD_0012beb8_caseD_1;
            }
            if (iVar2 == -0x25) goto LAB_0012c2ea;
            iVar2 = -7;
            pcVar7 = "Unable to send userauth-keyboard-interactive request";
          }
          _libssh2_error(session,iVar2,pcVar7);
        }
switchD_0012beb8_caseD_1:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        pLVar4 = session->userauth_kybd_prompts;
        pLVar5 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        if ((pLVar4 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) &&
           (pLVar5 = pLVar4, session->userauth_kybd_num_prompts != 0)) {
          lVar10 = 0;
          uVar9 = 0;
          do {
            (*session->free)(*(void **)((long)&pLVar4->text + lVar10),&session->abstract);
            pLVar4 = session->userauth_kybd_prompts;
            *(undefined8 *)((long)&pLVar4->text + lVar10) = 0;
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + 0x18;
            pLVar5 = pLVar4;
          } while (uVar9 < session->userauth_kybd_num_prompts);
        }
        pLVar8 = session->userauth_kybd_responses;
        if (pLVar8 == (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          pLVar8 = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        else if (session->userauth_kybd_num_prompts != 0) {
          lVar10 = 0;
          uVar9 = 0;
          do {
            (*session->free)(*(void **)((long)&pLVar8->text + lVar10),&session->abstract);
            pLVar8 = session->userauth_kybd_responses;
            *(undefined8 *)((long)&pLVar8->text + lVar10) = 0;
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar9 < session->userauth_kybd_num_prompts);
          pLVar5 = *local_68;
        }
        if (pLVar5 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(pLVar5,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
          pLVar8 = session->userauth_kybd_responses;
        }
        if (pLVar8 != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(pLVar8,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_failure != 0) {
          iVar2 = -1;
LAB_0012c3b6:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          return iVar2;
        }
      } while( true );
    }
    if (iVar2 == -0x25) {
LAB_0012c2ea:
      iVar2 = -0x25;
      pcVar7 = "Would block";
    }
    else {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar2 = -7;
      pcVar7 = "Unable to send keyboard-interactive request";
    }
    break;
  case libssh2_NB_state_sent:
    goto switchD_0012beb8_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_0012beb8_caseD_4;
  }
  goto LAB_0012c314;
LAB_0012c36a:
  (*session->free)(puVar3,&session->abstract);
  session->userauth_kybd_data = (uchar *)0x0;
  session->userauth_kybd_state = libssh2_NB_state_idle;
  iVar2 = -0x12;
  pcVar7 = "Authentication failed (keyboard-interactive)";
LAB_0012c314:
  iVar2 = _libssh2_error(session,iVar2,pcVar7);
  if (iVar2 != -0x25) {
    return iVar2;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar2 = _libssh2_wait_socket(session,local_38);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_0012be9a;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}